

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Widget_Type.cxx
# Opt level: O0

void when_cb(Fl_Choice *i,void *v)

{
  Fl_Widget *this;
  bool bVar1;
  int iVar2;
  Fl_When FVar3;
  long lVar4;
  Fl_Widget_Type *q;
  Fl_Type *o;
  int n_1;
  int m;
  int mod;
  int j;
  int n;
  void *v_local;
  Fl_Choice *i_local;
  
  if ((char *)v == "LOAD") {
    iVar2 = (*(current_widget->super_Fl_Type)._vptr_Fl_Type[0x1e])();
    if (iVar2 == 0) {
      Fl_Widget::activate((Fl_Widget *)i);
      FVar3 = Fl_Widget::when(current_widget->o);
      mod = FVar3 & ~FL_WHEN_NOT_CHANGED;
      if (mod == FL_WHEN_NEVER) {
        mod = 1000;
      }
      for (m = 0; m < 5; m = m + 1) {
        lVar4 = Fl_Menu_Item::argument(whenmenu + m);
        if (lVar4 == mod) {
          Fl_Choice::value(i,m);
          return;
        }
      }
    }
    else {
      Fl_Widget::deactivate((Fl_Widget *)i);
    }
  }
  else {
    bVar1 = false;
    iVar2 = Fl_Choice::value(i);
    lVar4 = Fl_Menu_Item::argument(whenmenu + iVar2);
    o._4_4_ = (int)lVar4;
    if (o._4_4_ != 0) {
      if (o._4_4_ == 1000) {
        o._4_4_ = 0;
      }
      for (q = (Fl_Widget_Type *)Fl_Type::first; q != (Fl_Widget_Type *)0x0;
          q = (Fl_Widget_Type *)(q->super_Fl_Type).next) {
        if (((q->super_Fl_Type).selected != '\0') &&
           (iVar2 = (*(q->super_Fl_Type)._vptr_Fl_Type[0x17])(), iVar2 != 0)) {
          this = q->o;
          FVar3 = Fl_Widget::when(q->o);
          Fl_Widget::when(this,(byte)o._4_4_ | (byte)FVar3 & 2);
          bVar1 = true;
        }
      }
      if (bVar1) {
        set_modflag(1);
      }
    }
  }
  return;
}

Assistant:

void when_cb(Fl_Choice* i, void *v) {
  if (v == LOAD) {
    if (current_widget->is_menu_item()) {i->deactivate(); return;} else i->activate();
    int n = current_widget->o->when() & (~FL_WHEN_NOT_CHANGED);
    if (!n) n = ZERO_ENTRY;
    for (int j = 0; j < int(sizeof(whenmenu)/sizeof(*whenmenu)); j++)
      if (whenmenu[j].argument() == n) {i->value(j); break;}
  } else {
    int mod = 0;
    int m = i->value();
    int n = int(whenmenu[m].argument());
    if (!n) return; // should not happen
    if (n == ZERO_ENTRY) n = 0;
    for (Fl_Type *o = Fl_Type::first; o; o = o->next) {
      if (o->selected && o->is_widget()) {
	Fl_Widget_Type* q = (Fl_Widget_Type*)o;
	q->o->when(n|(q->o->when()&FL_WHEN_NOT_CHANGED));
	mod = 1;
      }
    }
    if (mod) set_modflag(1);
  }
}